

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

bool __thiscall
QSocks5SocketEngine::initialize
          (QSocks5SocketEngine *this,qintptr socketDescriptor,SocketState socketState)

{
  QSocks5SocketEnginePrivate *this_00;
  QObject *pQVar1;
  NetworkLayerProtocol NVar2;
  Type *this_01;
  QSocks5BindData *this_02;
  QSocks5ConnectData *pQVar3;
  long lVar4;
  bool bVar5;
  long in_FS_OFFSET;
  Connection CStack_68;
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QAbstractSocket local_38;
  
  local_38._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  if (socketState == ConnectedState) {
    this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
    this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>::
              operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>
                          *)this);
    this_02 = QSocks5BindStore::retrieve(this_01,socketDescriptor);
    if (this_02 != (QSocks5BindData *)0x0) {
      (this_00->super_QAbstractSocketEnginePrivate).socketState = ConnectedState;
      (this_00->super_QAbstractSocketEnginePrivate).socketType = TcpSocket;
      pQVar3 = (QSocks5ConnectData *)operator_new(0x38);
      (pQVar3->readBuffer).buffers.d.d = (Data *)0x0;
      (pQVar3->readBuffer).buffers.d.ptr = (QRingChunk *)0x0;
      (pQVar3->readBuffer).buffers.d.size = 0;
      (pQVar3->readBuffer).bufferSize = 0;
      (pQVar3->readBuffer).basicBlockSize = 0x1000;
      this_00->connectData = pQVar3;
      this_00->data = (QSocks5Data *)pQVar3;
      this_00->mode = ConnectMode;
      pQVar1 = (QObject *)(this_02->super_QSocks5Data).controlSocket;
      (pQVar3->super_QSocks5Data).controlSocket = (QTcpSocket *)pQVar1;
      (this_02->super_QSocks5Data).controlSocket = (QTcpSocket *)0x0;
      QObject::setParent(pQVar1);
      QAbstractSocket::localAddress(&local_38);
      NVar2 = QHostAddress::protocol((QHostAddress *)&local_38);
      (this_00->super_QAbstractSocketEnginePrivate).socketProtocol = NVar2;
      QHostAddress::~QHostAddress((QHostAddress *)&local_38);
      this_00->data->authenticator = (this_02->super_QSocks5Data).authenticator;
      (this_02->super_QSocks5Data).authenticator = (QSocks5Authenticator *)0x0;
      (this_00->super_QAbstractSocketEnginePrivate).localPort = this_02->localPort;
      QHostAddress::operator=
                (&(this_00->super_QAbstractSocketEnginePrivate).localAddress,&this_02->localAddress)
      ;
      (this_00->super_QAbstractSocketEnginePrivate).peerPort = this_02->peerPort;
      QHostAddress::operator=
                (&(this_00->super_QAbstractSocketEnginePrivate).peerAddress,&this_02->peerAddress);
      (this_00->super_QAbstractSocketEnginePrivate).inboundStreamCount = 1;
      (this_00->super_QAbstractSocketEnginePrivate).outboundStreamCount = 1;
      QSocks5BindData::~QSocks5BindData(this_02);
      operator_delete(this_02,0x40);
      QObject::connect(local_40,(char *)this_00->data->controlSocket,(QObject *)"2connected()",
                       (char *)this,0x260b89);
      QMetaObject::Connection::~Connection((Connection *)local_40);
      QObject::connect(local_48,(char *)this_00->data->controlSocket,(QObject *)"2readyRead()",
                       (char *)this,0x260ba6);
      QMetaObject::Connection::~Connection((Connection *)local_48);
      QObject::connect(local_50,(char *)this_00->data->controlSocket,
                       (QObject *)"2bytesWritten(qint64)",(char *)this,0x260bca);
      QMetaObject::Connection::~Connection((Connection *)local_50);
      QObject::connect(local_58,(char *)this_00->data->controlSocket,
                       (QObject *)"2errorOccurred(QAbstractSocket::SocketError)",(char *)this,
                       0x260bea);
      QMetaObject::Connection::~Connection((Connection *)local_58);
      QObject::connect(local_60,(char *)this_00->data->controlSocket,(QObject *)"2disconnected()",
                       (char *)this,0x260c27);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      QObject::connect((QObject *)&CStack_68,(char *)this_00->data->controlSocket,
                       (QObject *)"2stateChanged(QAbstractSocket::SocketState)",(char *)this,
                       0x260c47);
      QMetaObject::Connection::~Connection(&CStack_68);
      this_00->socks5State = Connected;
      lVar4 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket + 0xa0))();
      bVar5 = true;
      if (lVar4 != 0) {
        QSocks5SocketEnginePrivate::_q_controlSocketReadNotification(this_00);
      }
      goto LAB_00220538;
    }
  }
  bVar5 = false;
LAB_00220538:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38._8_8_) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::initialize(qintptr socketDescriptor, QAbstractSocket::SocketState socketState)
{
    Q_D(QSocks5SocketEngine);

    QSOCKS5_Q_DEBUG << "initialize" << socketDescriptor;

    // this is only valid for the other side of a bind, nothing else is supported

    if (socketState != QAbstractSocket::ConnectedState) {
        //### must be connected state ???
        return false;
    }

    QSocks5BindData *bindData = socks5BindStore()->retrieve(socketDescriptor);
    if (bindData) {

        d->socketState = QAbstractSocket::ConnectedState;
        d->socketType = QAbstractSocket::TcpSocket;
        d->connectData = new QSocks5ConnectData;
        d->data = d->connectData;
        d->mode = QSocks5SocketEnginePrivate::ConnectMode;
        d->data->controlSocket = bindData->controlSocket;
        bindData->controlSocket = nullptr;
        d->data->controlSocket->setParent(this);
        d->socketProtocol = d->data->controlSocket->localAddress().protocol();
        d->data->authenticator = bindData->authenticator;
        bindData->authenticator = nullptr;
        d->localPort = bindData->localPort;
        d->localAddress = bindData->localAddress;
        d->peerPort = bindData->peerPort;
        d->peerAddress = bindData->peerAddress;
        d->inboundStreamCount = d->outboundStreamCount = 1;
        delete bindData;

        QObject::connect(d->data->controlSocket, SIGNAL(connected()), this, SLOT(_q_controlSocketConnected()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(readyRead()), this, SLOT(_q_controlSocketReadNotification()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(bytesWritten(qint64)), this, SLOT(_q_controlSocketBytesWritten()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(errorOccurred(QAbstractSocket::SocketError)), this, SLOT(_q_controlSocketErrorOccurred(QAbstractSocket::SocketError)),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(disconnected()), this, SLOT(_q_controlSocketDisconnected()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(stateChanged(QAbstractSocket::SocketState)),
                         this, SLOT(_q_controlSocketStateChanged(QAbstractSocket::SocketState)),
                         Qt::DirectConnection);

        d->socks5State = QSocks5SocketEnginePrivate::Connected;

        if (d->data->controlSocket->bytesAvailable() != 0)
            d->_q_controlSocketReadNotification();
        return true;
    }
    return false;
}